

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O1

parser_error parse_trap_appear(parser *p)

{
  uint uVar1;
  parser_error pVar2;
  void *pvVar3;
  
  pvVar3 = parser_priv(p);
  if (pvVar3 == (void *)0x0) {
    pVar2 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    uVar1 = parser_getuint(p,"rarity");
    *(uint *)((long)pvVar3 + 0x4c) = uVar1;
    uVar1 = parser_getuint(p,"mindepth");
    *(uint *)((long)pvVar3 + 0x50) = uVar1;
    uVar1 = parser_getuint(p,"maxnum");
    *(uint *)((long)pvVar3 + 0x54) = uVar1;
    pVar2 = PARSE_ERROR_NONE;
  }
  return pVar2;
}

Assistant:

static enum parser_error parse_trap_appear(struct parser *p) {
    struct trap_kind *t = parser_priv(p);

    if (!t)
		return PARSE_ERROR_MISSING_RECORD_HEADER;
    t->rarity =  parser_getuint(p, "rarity");
    t->min_depth =  parser_getuint(p, "mindepth");
    t->max_num =  parser_getuint(p, "maxnum");
    return PARSE_ERROR_NONE;
}